

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharBitvec::ToEquivClass<char16_t>
          (CharBitvec *this,ArenaAllocator *allocator,uint base,uint *tblidx,
          CharSet<char16_t> *result,codepoint_t baseOffset)

{
  uint uVar1;
  Char lc;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  uint h;
  int i;
  uint l;
  long lVar7;
  char16 local_78 [4];
  char16_t equivl [4];
  uint local_34 [2];
  uint acth;
  
  equivl = (char16_t  [4])result;
  iVar4 = NextSet(this,0);
  if (-1 < iVar4) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar5 = NextClear(this,iVar4 + 1);
      if (iVar5 < 0) {
        iVar5 = 0xff;
      }
      else {
        if (iVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0xa9,"(hi > 0)","hi > 0");
          if (!bVar3) {
LAB_00e5f349:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        iVar5 = iVar5 + -1;
      }
      l = iVar4 + baseOffset + base;
      h = baseOffset + base + iVar5;
      do {
        CaseInsensitive::RangeToEquivClass(tblidx,l,h,local_34,local_78);
        iVar4 = local_34[0] - l;
        lVar7 = 0;
        do {
          lc = local_78[lVar7];
          uVar1 = (uint)(ushort)lc + iVar4;
          if (0xffff < uVar1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                               ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
            if (!bVar3) goto LAB_00e5f349;
            *puVar6 = 0;
          }
          CharSet<char16_t>::SetRange((CharSet<char16_t> *)equivl,allocator,lc,(Char)uVar1);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        l = local_34[0] + 1;
      } while (l <= h);
      iVar4 = NextSet(this,iVar5 + 1);
    } while (-1 < iVar4);
  }
  return;
}

Assistant:

void CharBitvec::ToEquivClass(ArenaAllocator* allocator, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        int hi = -1;
        while (true)
        {
            // Find the next range of set bits in vector
            int li = NextSet(hi + 1);
            if (li < 0)
                return;
            hi = NextClear(li + 1);
            if (hi < 0)
                hi = Size - 1;
            else
            {
                Assert(hi > 0);
                hi--;
            }

            // Convert to character codes
            uint l = base + li + baseOffset;
            uint h = base + hi + baseOffset;

            do
            {
                uint acth;
                C equivl[CaseInsensitive::EquivClassSize];
                CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
                uint n = acth - l;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
                }

                // Go around again for rest of this range
                l = acth + 1;
            }
            while (l <= h);
        }
    }